

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O3

int run_test_tcp_close_after_read_timeout(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 *extraout_RDX;
  int64_t eval_b_1;
  int64_t eval_b;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_tcp_t tcp_server;
  undefined8 uStack_128;
  code *pcStack_120;
  long local_110;
  long local_108 [2];
  undefined8 local_f8;
  undefined1 local_f0 [16];
  long local_e0 [27];
  
  pcStack_120 = (code *)0x1c885a;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_f0);
  local_e0[0] = (long)iVar1;
  local_108[0] = 0;
  if (local_e0[0] == 0) {
    pcStack_120 = (code *)0x1c887f;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1c8898;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_108);
    local_e0[0] = (long)iVar1;
    local_110 = 0;
    if (local_e0[0] != 0) goto LAB_001c8b42;
    pcStack_120 = (code *)0x1c88c5;
    iVar1 = uv_tcp_init(uVar2,local_e0);
    local_110 = (long)iVar1;
    local_f8 = 0;
    if (local_110 != 0) goto LAB_001c8b51;
    pcStack_120 = (code *)0x1c88f6;
    iVar1 = uv_tcp_bind(local_e0,local_108,0);
    local_110 = (long)iVar1;
    local_f8 = 0;
    if (local_110 != 0) goto LAB_001c8b60;
    pcStack_120 = (code *)0x1c892c;
    iVar1 = uv_listen(local_e0,0x80,on_connection);
    local_110 = (long)iVar1;
    local_f8 = 0;
    if (local_110 != 0) goto LAB_001c8b6f;
    pcStack_120 = (code *)0x1c8956;
    uv_unref(local_e0);
    pcStack_120 = (code *)0x1c8965;
    iVar1 = uv_tcp_init(uVar2,&client);
    local_108[0] = (long)iVar1;
    local_110 = 0;
    if (local_108[0] != 0) goto LAB_001c8b7e;
    pcStack_120 = (code *)0x1c89a4;
    iVar1 = uv_tcp_connect(&connect_req,&client,local_f0,on_client_connect);
    local_108[0] = (long)iVar1;
    local_110 = 0;
    if (local_108[0] != 0) goto LAB_001c8b8d;
    pcStack_120 = (code *)0x1c89d3;
    iVar1 = uv_tcp_init(uVar2,&connection);
    local_108[0] = (long)iVar1;
    local_110 = 0;
    if (local_108[0] != 0) goto LAB_001c8b9c;
    pcStack_120 = (code *)0x1c8a02;
    iVar1 = uv_timer_init(uVar2,&timer);
    local_108[0] = (long)iVar1;
    local_110 = 0;
    if (local_108[0] != 0) goto LAB_001c8bab;
    local_108[0] = (long)read_cb_called;
    local_110 = 0;
    if (local_108[0] != 0) goto LAB_001c8bba;
    local_108[0] = (long)on_close_called;
    local_110 = 0;
    if (local_108[0] != 0) goto LAB_001c8bc9;
    pcStack_120 = (code *)0x1c8a76;
    iVar1 = uv_run(uVar2,0);
    local_108[0] = (long)iVar1;
    local_110 = 0;
    if (local_108[0] != 0) goto LAB_001c8bd8;
    local_108[0] = 1;
    local_110 = (long)read_cb_called;
    if (local_110 != 1) goto LAB_001c8be7;
    local_108[0] = 3;
    local_110 = (long)on_close_called;
    if (local_110 != 3) goto LAB_001c8bf6;
    pcStack_120 = (code *)0x1c8af1;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_120 = (code *)0x1c8afb;
    uv_run(uVar2,0);
    local_108[0] = 0;
    pcStack_120 = (code *)0x1c8b0c;
    iVar1 = uv_loop_close(uVar2);
    local_110 = (long)iVar1;
    if (local_108[0] == local_110) {
      pcStack_120 = (code *)0x1c8b28;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x1c8b42;
    run_test_tcp_close_after_read_timeout_cold_1();
LAB_001c8b42:
    pcStack_120 = (code *)0x1c8b51;
    run_test_tcp_close_after_read_timeout_cold_2();
LAB_001c8b51:
    pcStack_120 = (code *)0x1c8b60;
    run_test_tcp_close_after_read_timeout_cold_3();
LAB_001c8b60:
    pcStack_120 = (code *)0x1c8b6f;
    run_test_tcp_close_after_read_timeout_cold_4();
LAB_001c8b6f:
    pcStack_120 = (code *)0x1c8b7e;
    run_test_tcp_close_after_read_timeout_cold_5();
LAB_001c8b7e:
    pcStack_120 = (code *)0x1c8b8d;
    run_test_tcp_close_after_read_timeout_cold_6();
LAB_001c8b8d:
    pcStack_120 = (code *)0x1c8b9c;
    run_test_tcp_close_after_read_timeout_cold_7();
LAB_001c8b9c:
    pcStack_120 = (code *)0x1c8bab;
    run_test_tcp_close_after_read_timeout_cold_8();
LAB_001c8bab:
    pcStack_120 = (code *)0x1c8bba;
    run_test_tcp_close_after_read_timeout_cold_9();
LAB_001c8bba:
    pcStack_120 = (code *)0x1c8bc9;
    run_test_tcp_close_after_read_timeout_cold_10();
LAB_001c8bc9:
    pcStack_120 = (code *)0x1c8bd8;
    run_test_tcp_close_after_read_timeout_cold_11();
LAB_001c8bd8:
    pcStack_120 = (code *)0x1c8be7;
    run_test_tcp_close_after_read_timeout_cold_12();
LAB_001c8be7:
    pcStack_120 = (code *)0x1c8bf6;
    run_test_tcp_close_after_read_timeout_cold_13();
LAB_001c8bf6:
    pcStack_120 = (code *)0x1c8c05;
    run_test_tcp_close_after_read_timeout_cold_14();
  }
  pcStack_120 = on_client_connect;
  run_test_tcp_close_after_read_timeout_cold_15();
  iVar1 = uv_read_start(&client,on_client_alloc,on_client_read);
  pcStack_120 = (code *)(long)iVar1;
  uStack_128 = 0;
  if (pcStack_120 == (code *)0x0) {
    iVar1 = uv_timer_start(&timer,on_client_timeout,1000,0);
    pcStack_120 = (code *)(long)iVar1;
    uStack_128 = 0;
    if (pcStack_120 == (code *)0x0) {
      return iVar1;
    }
  }
  else {
    on_client_connect_cold_1();
  }
  iVar1 = (int)&uStack_128;
  on_client_connect_cold_2();
  if (iVar1 == 0) {
    iVar1 = uv_accept();
    if (iVar1 == 0) {
      iVar1 = uv_read_start(&connection,on_connection_alloc,on_connection_read);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001c8d49;
    }
  }
  else {
    on_connection_cold_1();
  }
  on_connection_cold_2();
LAB_001c8d49:
  on_connection_cold_3();
  *extraout_RDX = on_connection_alloc::slab;
  extraout_RDX[1] = 8;
  return 0x37e198;
}

Assistant:

TEST_IMPL(tcp_close_after_read_timeout) {
  struct sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_loop_t* loop;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  loop = uv_default_loop();

  /* We can't use the echo server, it doesn't handle ECONNRESET. */
  start_server(loop, &tcp_server);

  r = uv_tcp_init(loop, &client);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     on_client_connect);
  ASSERT_OK(r);

  r = uv_tcp_init(loop, &connection);
  ASSERT_OK(r);

  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  ASSERT_OK(read_cb_called);
  ASSERT_OK(on_close_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(3, on_close_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}